

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1816::run(TestCase1816 *this)

{
  float fVar1;
  float local_128;
  float local_124;
  Builder root;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestWholeFloatDefault>
            (&root,&message.super_MessageBuilder);
  if ((float)(*root._builder.data ^ 0x42f60000) != 123.0 && kj::_::Debug::minSeverity < 3) {
    local_124 = 123.0;
    local_128 = (float)(*root._builder.data ^ 0x42f60000);
    kj::_::Debug::log<char_const(&)[47],float,float>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x71c,ERROR,
               "\"failed: expected \" \"(123.0f) == (root.getField())\", 123.0f, root.getField()",
               (char (*) [47])"failed: expected (123.0f) == (root.getField())",&local_124,&local_128
              );
  }
  fVar1 = (float)(*(uint *)((long)root._builder.data + 4) ^ 0x71c9f2ca);
  if (((fVar1 != 2e+30) || (NAN(fVar1))) && (kj::_::Debug::minSeverity < 3)) {
    local_124 = 2e+30;
    local_128 = fVar1;
    kj::_::Debug::log<char_const(&)[49],float,float>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x71d,ERROR,
               "\"failed: expected \" \"(2e30f) == (root.getBigField())\", 2e30f, root.getBigField()"
               ,(char (*) [49])"failed: expected (2e30f) == (root.getBigField())",&local_124,
               &local_128);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Encoding, WholeFloatDefault) {
  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestWholeFloatDefault>();

  EXPECT_EQ(123.0f, root.getField());
  EXPECT_EQ(2e30f, root.getBigField());
  EXPECT_EQ(456.0f, test::TestWholeFloatDefault::CONSTANT);
  EXPECT_EQ(4e30f, test::TestWholeFloatDefault::BIG_CONSTANT);
}